

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void PartialCRCBitByBitTest<unsigned_short,(unsigned_short)16>
               (char *data,size_t size,Parameters<unsigned_short,_(unsigned_short)16> *parameters,
               unsigned_short expectedCRC,string *crcName)

{
  unsigned_short uVar1;
  undefined2 in_CX;
  size_t in_R8;
  unsigned_short computedCRC;
  bool in_stack_0000009f;
  string *in_stack_000000a0;
  unsigned_short in_stack_000000ac;
  unsigned_short in_stack_000000ae;
  Parameters<unsigned_short,_(unsigned_short)16> *in_stack_000000b0;
  size_t in_stack_000000b8;
  void *in_stack_000000c0;
  unsigned_short in_stack_ffffffffffffffce;
  undefined6 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd6;
  undefined6 in_stack_ffffffffffffffe0;
  
  uVar1 = CRC::Calculate<unsigned_short,(unsigned_short)16>
                    ((void *)CONCAT26(in_CX,in_stack_ffffffffffffffe0),in_R8,
                     (Parameters<unsigned_short,_(unsigned_short)16> *)
                     CONCAT26(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0));
  CRC::Calculate<unsigned_short,(unsigned_short)16>
            ((void *)CONCAT26(in_CX,in_stack_ffffffffffffffe0),in_R8,
             (Parameters<unsigned_short,_(unsigned_short)16> *)
             CONCAT26(uVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffce);
  PrintResult<unsigned_short,(unsigned_short)16>
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000ae,
             in_stack_000000ac,in_stack_000000a0,in_stack_0000009f);
  return;
}

Assistant:

static void PartialCRCBitByBitTest(const char * data, size_t size, const CRC::Parameters<CRCType, CRCWidth> & parameters, CRCType expectedCRC, const std::string & crcName)
{
    CRCType computedCRC = CRC::Calculate(data, size / 2, parameters);

    // Don't forget (size + 1) to round odd numbers properly!
    computedCRC = CRC::Calculate(data + (size / 2), (size + 1) / 2, parameters, computedCRC);

    PrintResult<CRCType, CRCWidth>(data, size, parameters, expectedCRC, computedCRC, crcName, true);
}